

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ParseContext::
ParseContext<google::protobuf::stringpiece_internal::StringPiece&>
          (ParseContext *this,int depth,bool aliasing,char **start,StringPiece *args)

{
  char *pcVar1;
  undefined7 in_register_00000011;
  
  (this->super_EpsCopyInputStream).buffer_[8] = '\0';
  (this->super_EpsCopyInputStream).buffer_[9] = '\0';
  (this->super_EpsCopyInputStream).buffer_[10] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0xb] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0xc] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0xd] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0xe] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0xf] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x10] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x11] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x12] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x13] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x14] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x15] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x16] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x17] = '\0';
  (this->super_EpsCopyInputStream).zcis_ = (ZeroCopyInputStream *)0x0;
  (this->super_EpsCopyInputStream).buffer_[0] = '\0';
  (this->super_EpsCopyInputStream).buffer_[1] = '\0';
  (this->super_EpsCopyInputStream).buffer_[2] = '\0';
  (this->super_EpsCopyInputStream).buffer_[3] = '\0';
  (this->super_EpsCopyInputStream).buffer_[4] = '\0';
  (this->super_EpsCopyInputStream).buffer_[5] = '\0';
  (this->super_EpsCopyInputStream).buffer_[6] = '\0';
  (this->super_EpsCopyInputStream).buffer_[7] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x18] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x19] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x1a] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x1b] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x1c] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x1d] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x1e] = '\0';
  (this->super_EpsCopyInputStream).buffer_[0x1f] = '\0';
  (this->super_EpsCopyInputStream).aliasing_ = CONCAT71(in_register_00000011,aliasing) & 0xffffffff;
  (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
  (this->super_EpsCopyInputStream).overall_limit_ = 0x7fffffff;
  this->depth_ = depth;
  this->group_depth_ = -0x80000000;
  (this->data_).arena = (Arena *)0x0;
  (this->data_).pool = (DescriptorPool *)0x0;
  (this->data_).factory = (MessageFactory *)0x0;
  pcVar1 = EpsCopyInputStream::InitFrom(&this->super_EpsCopyInputStream,*args);
  *start = pcVar1;
  return;
}

Assistant:

explicit EpsCopyInputStream(bool enable_aliasing)
      : aliasing_(enable_aliasing ? kOnPatch : kNoAliasing) {}